

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void FFSMarshalInstallMetadata(SstStream Stream,TSMetadataMsg MetaData)

{
  SstStream in_RSI;
  long in_RDI;
  int i;
  int in_stack_00000094;
  TSMetadataMsg in_stack_00000098;
  SstStream in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar1;
  
  FFSMarshalInstallPreciousMetadata
            (in_RSI,(TSMetadataMsg)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x238); iVar1 = iVar1 + 1) {
    BuildVarList(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  }
  return;
}

Assistant:

extern void FFSMarshalInstallMetadata(SstStream Stream, TSMetadataMsg MetaData)
{
    FFSMarshalInstallPreciousMetadata(Stream, MetaData);

    for (int i = 0; i < Stream->WriterCohortSize; i++)
    {
        BuildVarList(Stream, MetaData, i);
    }
}